

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O2

void __thiscall
MultipleInheritanceFailure_Test5_Test::MultipleInheritanceFailure_Test5_Test
          (MultipleInheritanceFailure_Test5_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00189c18;
  return;
}

Assistant:

TEST(MultipleInheritanceFailure, Test5){
    Infector::Container ioc;
    ioc.bindSingleAs<concreteA, IA>();

    try{
        ioc.bindSingleAs<concreteABC, IA, IB, IC>();
    }catch(std::exception &ex){
        std::cout<<"ex 1"<<std::endl;
        std::cout<<ex.what()<<std::endl;
    }
    ioc.bindSingleAs<concreteBC,IB,IC>();

    ioc.wire<concreteA>();
    ioc.wire<concreteBC>();
    std::cout<<"step1"<<std::endl;
    try{
        ioc.wire<concreteABC>(); // that will never be used.. throw?

    }
    catch(std::exception &ex){
        std::cout<<"ex 2"<<std::endl;
        std::cout<<ex.what()<<std::endl;
    }
    std::cout<<"step2"<<std::endl;
    try{
        auto a=ioc.buildSingle<IA>();
        auto bcb=ioc.buildSingle<IB>();
        auto bcc=ioc.buildSingle<IC>();
        a->doA();
        bcb->doB();
        bcc->doC();
    }
    catch(std::exception &ex){
        std::cout<<"ex 3"<<std::endl;
        std::cout<<ex.what()<<std::endl;
    }
}